

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

cmListFileLexer_BOM cmListFileLexer_ReadBOM(FILE *f)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_30 [8];
  fpos_t p;
  uchar b [2];
  FILE *f_local;
  
  sVar2 = fread((void *)((long)&p.__state.__value + 2),1,2,(FILE *)f);
  if (sVar2 == 2) {
    if ((p.__state.__value.__wchb[2] == -0x11) && (p.__state.__value.__wchb[3] == -0x45)) {
      sVar2 = fread((void *)((long)&p.__state.__value + 2),1,1,(FILE *)f);
      if ((sVar2 == 1) && (p.__state.__value.__wchb[2] == -0x41)) {
        return cmListFileLexer_BOM_UTF8;
      }
    }
    else {
      if ((p.__state.__value.__wchb[2] == -2) && (p.__state.__value.__wchb[3] == -1)) {
        return cmListFileLexer_BOM_UTF16BE;
      }
      if ((p.__state.__value.__wchb[2] == '\0') && (p.__state.__value.__wchb[3] == '\0')) {
        sVar2 = fread((void *)((long)&p.__state.__value + 2),1,2,(FILE *)f);
        if (((sVar2 == 2) && (p.__state.__value.__wchb[2] == -2)) &&
           (p.__state.__value.__wchb[3] == -1)) {
          return cmListFileLexer_BOM_UTF32BE;
        }
      }
      else if ((p.__state.__value.__wchb[2] == -1) && (p.__state.__value.__wchb[3] == -2)) {
        fgetpos((FILE *)f,(fpos_t *)local_30);
        sVar2 = fread((void *)((long)&p.__state.__value + 2),1,2,(FILE *)f);
        if (((sVar2 == 2) && (p.__state.__value.__wchb[2] == '\0')) &&
           (p.__state.__value.__wchb[3] == '\0')) {
          return cmListFileLexer_BOM_UTF32LE;
        }
        iVar1 = fsetpos((FILE *)f,(fpos_t *)local_30);
        if (iVar1 != 0) {
          return cmListFileLexer_BOM_Broken;
        }
        return cmListFileLexer_BOM_UTF16LE;
      }
    }
  }
  iVar1 = fseek((FILE *)f,0,0);
  f_local._4_4_ = (cmListFileLexer_BOM)(iVar1 != 0);
  return f_local._4_4_;
}

Assistant:

static cmListFileLexer_BOM cmListFileLexer_ReadBOM(FILE* f)
{
  unsigned char b[2];
  if (fread(b, 1, 2, f) == 2) {
    if (b[0] == 0xEF && b[1] == 0xBB) {
      if (fread(b, 1, 1, f) == 1 && b[0] == 0xBF) {
        return cmListFileLexer_BOM_UTF8;
      }
    } else if (b[0] == 0xFE && b[1] == 0xFF) {
      /* UTF-16 BE */
      return cmListFileLexer_BOM_UTF16BE;
    } else if (b[0] == 0 && b[1] == 0) {
      if (fread(b, 1, 2, f) == 2 && b[0] == 0xFE && b[1] == 0xFF) {
        return cmListFileLexer_BOM_UTF32BE;
      }
    } else if (b[0] == 0xFF && b[1] == 0xFE) {
      fpos_t p;
      fgetpos(f, &p);
      if (fread(b, 1, 2, f) == 2 && b[0] == 0 && b[1] == 0) {
        return cmListFileLexer_BOM_UTF32LE;
      }
      if (fsetpos(f, &p) != 0) {
        return cmListFileLexer_BOM_Broken;
      }
      return cmListFileLexer_BOM_UTF16LE;
    }
  }
  if (fseek(f, 0, SEEK_SET) != 0) {
    return cmListFileLexer_BOM_Broken;
  }
  return cmListFileLexer_BOM_None;
}